

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.cxx
# Opt level: O0

pair<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_*,_std::vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>_>,_bool>
 __thiscall
ArgumentParser::PositionActionMap::Emplace
          (PositionActionMap *this,size_t pos,PositionAction *action)

{
  bool bVar1;
  pointer ppVar2;
  pair<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_*,_std::vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>_>,_bool>
  pVar3;
  bool local_81;
  const_iterator local_80;
  __normal_iterator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_*,_std::vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>_>
  local_78 [3];
  bool local_59;
  __normal_iterator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_*,_std::vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>_>
  local_58 [2];
  pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>
  *local_48;
  pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>
  *local_40;
  __normal_iterator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_*,_std::vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>_>
  local_38;
  __normal_iterator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_*,_std::vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>_>
  it;
  PositionAction *action_local;
  size_t pos_local;
  PositionActionMap *this_local;
  undefined1 local_10;
  
  it._M_current =
       (pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>
        *)action;
  action_local = (PositionAction *)pos;
  pos_local = (size_t)this;
  local_40 = (pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>
              *)std::
                vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                ::begin(&this->
                         super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                       );
  local_48 = (pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>
              *)std::
                vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                ::end(&this->
                       super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                     );
  local_38 = std::
             lower_bound<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,std::function<void(ArgumentParser::Instance&,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)>>*,std::vector<std::pair<unsigned_long,std::function<void(ArgumentParser::Instance&,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)>>,std::allocator<std::pair<unsigned_long,std::function<void(ArgumentParser::Instance&,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)>>>>>,unsigned_long,ArgumentParser::PositionActionMap::Emplace(unsigned_long,std::function<void(ArgumentParser::Instance&,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)>)::__0>
                       (local_40,local_48,&action_local);
  local_58[0]._M_current =
       (pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>
        *)std::
          vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
          ::end(&this->
                 super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
               );
  bVar1 = __gnu_cxx::operator!=(&local_38,local_58);
  if ((bVar1) &&
     (ppVar2 = __gnu_cxx::
               __normal_iterator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_*,_std::vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>_>
               ::operator->(&local_38), (PositionAction *)ppVar2->first == action_local)) {
    local_59 = false;
    pVar3 = std::
            make_pair<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,std::function<void(ArgumentParser::Instance&,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)>>*,std::vector<std::pair<unsigned_long,std::function<void(ArgumentParser::Instance&,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)>>,std::allocator<std::pair<unsigned_long,std::function<void(ArgumentParser::Instance&,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)>>>>>const&,bool>
                      (&local_38,&local_59);
    local_10 = pVar3.second;
  }
  else {
    __gnu_cxx::
    __normal_iterator<std::pair<unsigned_long,std::function<void(ArgumentParser::Instance&,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)>>const*,std::vector<std::pair<unsigned_long,std::function<void(ArgumentParser::Instance&,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)>>,std::allocator<std::pair<unsigned_long,std::function<void(ArgumentParser::Instance&,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)>>>>>
    ::
    __normal_iterator<std::pair<unsigned_long,std::function<void(ArgumentParser::Instance&,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)>>*>
              ((__normal_iterator<std::pair<unsigned_long,std::function<void(ArgumentParser::Instance&,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)>>const*,std::vector<std::pair<unsigned_long,std::function<void(ArgumentParser::Instance&,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)>>,std::allocator<std::pair<unsigned_long,std::function<void(ArgumentParser::Instance&,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)>>>>>
                *)&local_80,&local_38);
    local_78[0]._M_current =
         (pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>
          *)std::
            vector<std::pair<unsigned_long,std::function<void(ArgumentParser::Instance&,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)>>,std::allocator<std::pair<unsigned_long,std::function<void(ArgumentParser::Instance&,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)>>>>
            ::
            emplace<unsigned_long&,std::function<void(ArgumentParser::Instance&,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)>>
                      ((vector<std::pair<unsigned_long,std::function<void(ArgumentParser::Instance&,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)>>,std::allocator<std::pair<unsigned_long,std::function<void(ArgumentParser::Instance&,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)>>>>
                        *)this,local_80,(unsigned_long *)&action_local,action);
    local_81 = true;
    pVar3 = std::
            make_pair<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,std::function<void(ArgumentParser::Instance&,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)>>*,std::vector<std::pair<unsigned_long,std::function<void(ArgumentParser::Instance&,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)>>,std::allocator<std::pair<unsigned_long,std::function<void(ArgumentParser::Instance&,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)>>>>>,bool>
                      (local_78,&local_81);
    local_10 = pVar3.second;
  }
  this_local = (PositionActionMap *)pVar3.first._M_current;
  pVar3.second = (bool)local_10;
  pVar3.first._M_current =
       (pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>
        *)this_local;
  return pVar3;
}

Assistant:

auto PositionActionMap::Emplace(std::size_t pos, PositionAction action)
  -> std::pair<iterator, bool>
{
  auto const it = std::lower_bound(
    this->begin(), this->end(), pos,
    [](value_type const& elem, std::size_t k) { return elem.first < k; });
  return (it != this->end() && it->first == pos)
    ? std::make_pair(it, false)
    : std::make_pair(this->emplace(it, pos, std::move(action)), true);
}